

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O3

Lazy<cinatra::resp_data> __thiscall
cinatra::coro_http_client::async_upload_multipart(coro_http_client *this,string *uri)

{
  size_t *psVar1;
  char *pcVar2;
  element_type *peVar3;
  long *in_RDX;
  http_header *phVar4;
  
  peVar3 = (element_type *)operator_new(0x138,(nothrow_t *)&std::nothrow);
  if (peVar3 == (element_type *)0x0) {
    (this->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    *(code **)&(peVar3->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
               super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2> =
         async_upload_multipart;
    ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(peVar3->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
            super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)async_upload_multipart;
    (((http_header *)((long)(peVar3->parser_).headers_._M_elems + 0xe0))->name)._M_len = (size_t)uri
    ;
    phVar4 = (http_header *)((long)(peVar3->parser_).headers_._M_elems + 0xa0);
    ((string_view *)((long)(peVar3->parser_).headers_._M_elems + 0x90))->_M_len = (size_t)phVar4;
    psVar1 = (size_t *)(in_RDX + 2);
    if ((size_t *)*in_RDX == psVar1) {
      pcVar2 = (char *)in_RDX[3];
      (phVar4->name)._M_len = *psVar1;
      *(char **)((long)(peVar3->parser_).headers_._M_elems + 0xa8) = pcVar2;
    }
    else {
      ((string_view *)((long)(peVar3->parser_).headers_._M_elems + 0x90))->_M_len = (size_t)*in_RDX;
      (((http_header *)((long)(peVar3->parser_).headers_._M_elems + 0xa0))->name)._M_len = *psVar1;
    }
    *(char **)((long)(peVar3->parser_).headers_._M_elems + 0x98) = (char *)in_RDX[1];
    *in_RDX = (long)psVar1;
    in_RDX[1] = 0;
    *(undefined1 *)(in_RDX + 2) = 0;
    (peVar3->parser_).msg_._M_str = (char *)0x0;
    *(undefined8 *)&peVar3->parser_ = 0;
    (peVar3->parser_).msg_._M_len = 0;
    *(undefined1 *)((long)(peVar3->parser_).headers_._M_elems + 0x18) = 0;
    (this->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
    *(undefined1 *)((long)(peVar3->parser_).headers_._M_elems + 0xe8) = 0;
  }
  return (LazyBase<cinatra::resp_data,_false>)(LazyBase<cinatra::resp_data,_false>)this;
}

Assistant:

async_simple::coro::Lazy<resp_data> async_upload_multipart(std::string uri) {
    if (form_data_.empty()) {
      CINATRA_LOG_WARNING << "no multipart";
      co_return resp_data{std::make_error_code(std::errc::invalid_argument),
                          404};
    }

    co_return co_await async_upload_impl<upload_type_t::multipart>(
        std::move(uri), http_method::POST, upload_type_t::multipart,
        req_content_type::multipart);
  }